

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall
filesystemcollection::addfs(filesystemcollection *this,FileContainer_ptr *fs,string *name)

{
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>,_bool>
  pVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>
  local_50;
  
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>
  ::pair<std::shared_ptr<FileContainer>_&,_true>(&local_50,name,fs);
  pVar1 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<FileContainer>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<FileContainer>>>,caseinsensitive,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<FileContainer>>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::shared_ptr<FileContainer>>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<FileContainer>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<FileContainer>>>,caseinsensitive,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<FileContainer>>>>
                      *)this,&local_50);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>
  ::~pair(&local_50);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    printf("WARNING: duplicate filesystem name %s\n",(name->_M_dataplus)._M_p);
  }
  return;
}

Assistant:

void addfs(FileContainer_ptr fs, const std::string& name)
    {
        auto ins= _byname.insert(fsmap_t::value_type(name, fs));
        if (!ins.second) {
            printf("WARNING: duplicate filesystem name %s\n", name.c_str());
        }
    }